

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

void bio_hdrarg_free(char **argname,char **argval)

{
  int local_1c;
  int32 i;
  char **argval_local;
  char **argname_local;
  
  if (argname != (char **)0x0) {
    for (local_1c = 0; argname[local_1c] != (char *)0x0; local_1c = local_1c + 1) {
      ckd_free(argname[local_1c]);
      ckd_free(argval[local_1c]);
    }
    ckd_free(argname);
    ckd_free(argval);
  }
  return;
}

Assistant:

void
bio_hdrarg_free(char **argname, char **argval)
{
    int32 i;

    if (argname == NULL)
        return;
    for (i = 0; argname[i]; i++) {
        ckd_free(argname[i]);
        ckd_free(argval[i]);
    }
    ckd_free(argname);
    ckd_free(argval);
}